

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_model *
rf_load_model_from_obj
          (rf_model *__return_storage_ptr__,char *filename,rf_allocator allocator,
          rf_allocator temp_allocator,rf_io_callbacks io)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 *puVar5;
  rf_source_location source_location;
  rf_source_location rVar6;
  rf_source_location rVar7;
  rf_source_location rVar8;
  rf_source_location rVar9;
  rf_source_location rVar10;
  rf_source_location rVar11;
  rf_source_location rVar12;
  rf_model model_00;
  rf_allocator_args rVar13;
  rf_allocator_args rVar14;
  rf_allocator_args rVar15;
  rf_allocator temp_allocator_00;
  rf_allocator temp_allocator_01;
  rf_allocator temp_allocator_02;
  rf_allocator temp_allocator_03;
  rf_allocator temp_allocator_04;
  rf_allocator allocator_00;
  rf_allocator allocator_01;
  undefined1 auVar16 [24];
  undefined1 auVar17 [24];
  undefined1 auVar18 [24];
  undefined1 auVar19 [24];
  rf_mesh *prVar20;
  int iVar21;
  void *__s;
  void *__s_00;
  float *pfVar22;
  rf_allocator_proc *prVar23;
  long lVar24;
  void *pvVar25;
  long *in_FS_OFFSET;
  undefined8 local_4d8;
  undefined8 local_4d0;
  undefined8 local_4c8;
  undefined8 local_4c0;
  undefined8 local_4b8;
  rf_texture2d local_4b0;
  undefined4 local_498;
  undefined4 local_494;
  rf_texture2d local_490;
  undefined4 local_478;
  rf_texture2d local_474;
  undefined4 local_45c;
  rf_texture2d local_458;
  undefined8 local_440;
  undefined8 local_438;
  undefined8 local_430;
  rf_material local_428;
  rf_mesh *local_390;
  rf_int m_1;
  rf_int v_5;
  rf_int v_4;
  rf_int v_3;
  rf_int v_2;
  rf_int v_1;
  rf_int v;
  int iStack_350;
  tinyobj_vertex_index_t idx2;
  tinyobj_vertex_index_t idx1;
  tinyobj_vertex_index_t idx0;
  rf_int f;
  int local_320;
  int vnCount;
  int vtCount;
  int vCount;
  uint uStack_304;
  uint uStack_2d4;
  uint uStack_2a4;
  uint uStack_274;
  int local_258;
  uint local_254;
  rf_mesh mesh;
  rf_int m;
  uint uStack_1cc;
  uint uStack_19c;
  uint uStack_16c;
  int ret;
  uint flags;
  size_t material_count;
  tinyobj_material_t *materials;
  size_t mesh_count;
  tinyobj_shape_t *meshes;
  tinyobj_attrib_t attrib;
  rf_model model;
  char *filename_local;
  rf_allocator temp_allocator_local;
  rf_allocator allocator_local;
  
  prVar23 = allocator.allocator_proc;
  temp_allocator_local.allocator_proc = (rf_allocator_proc *)allocator.user_data;
  temp_allocator_local.user_data = temp_allocator.allocator_proc;
  pvVar25 = temp_allocator.user_data;
  memset(&attrib.material_ids,0,0x80);
  memset(&meshes,0,0x48);
  mesh_count = 0;
  materials = (tinyobj_material_t *)0x0;
  material_count = 0;
  _ret = (rf_mesh *)0x0;
  lVar24 = *in_FS_OFFSET;
  *(void **)(lVar24 + -0x440) = pvVar25;
  *(void **)(lVar24 + -0x438) = temp_allocator_local.user_data;
  lVar24 = *in_FS_OFFSET;
  *(void **)(lVar24 + -0x430) = io.user_data;
  *(_func_rf_int_void_ptr_char_ptr **)(lVar24 + -0x428) = io.file_size_proc;
  *(_func__Bool_void_ptr_char_ptr_void_ptr_rf_int **)(lVar24 + -0x420) = io.read_file_proc;
  iVar21 = tinyobj_parse_obj((tinyobj_attrib_t *)&meshes,(tinyobj_shape_t **)&mesh_count,
                             (size_t *)&materials,(tinyobj_material_t **)&material_count,
                             (size_t *)&ret,filename,rf_tinyobj_file_reader_callback,1);
  if (iVar21 == 0) {
    source_location.proc_name._0_4_ = 0x1b3323;
    source_location.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    source_location.proc_name._4_4_ = 0;
    source_location.line_in_file = 0x825d;
    rf_log_impl(source_location,RF_LOG_TYPE_INFO,
                "Model data loaded successfully: %i meshes / %i materials, filename: %s",materials,
                _ret,filename,"rf_load_model_from_obj");
  }
  else {
    rf_log_impl(4,0x1b333a,filename);
  }
  rVar6.proc_name._0_4_ = 0x1b3323;
  rVar6.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar6.proc_name._4_4_ = 0;
  rVar6.line_in_file = 0x8265;
  rVar13._16_8_ = (ulong)uStack_16c << 0x20;
  rVar13.pointer_to_free_or_realloc = (void *)SUB168(ZEXT816(0x70) << 0x40,0);
  rVar13.size_to_allocate_or_reallocate = SUB168(ZEXT816(0x70) << 0x40,8);
  __s = (*prVar23)((rf_allocator *)&temp_allocator_local.allocator_proc,rVar6,RF_AM_ALLOC,rVar13);
  memset(__s,0,0x70);
  prVar20 = _ret;
  if (_ret != (rf_mesh *)0x0) {
    model.meshes = _ret;
    rVar7.proc_name._0_4_ = 0x1b3323;
    rVar7.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    rVar7.proc_name._4_4_ = 0;
    rVar7.line_in_file = 0x826d;
    auVar16._8_8_ = (ulong)uStack_19c << 0x20;
    auVar16._0_8_ = (long)_ret * 0x98;
    auVar16._16_8_ = 0;
    model.material_count =
         (rf_int)(*prVar23)((rf_allocator *)&temp_allocator_local.allocator_proc,rVar7,RF_AM_ALLOC,
                            (rf_allocator_args)(auVar16 << 0x40));
    memset((void *)model.material_count,0,(long)prVar20 * 0x98);
  }
  rVar8.proc_name._0_4_ = 0x1b3323;
  rVar8.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar8.proc_name._4_4_ = 0;
  rVar8.line_in_file = 0x8271;
  rVar14._16_8_ = (ulong)uStack_1cc << 0x20;
  rVar14.pointer_to_free_or_realloc = (void *)SUB168(ZEXT816(4) << 0x40,0);
  rVar14.size_to_allocate_or_reallocate = SUB168(ZEXT816(4) << 0x40,8);
  __s_00 = (*prVar23)((rf_allocator *)&temp_allocator_local.allocator_proc,rVar8,RF_AM_ALLOC,rVar14)
  ;
  memset(__s_00,0,4);
  for (mesh.vbo_id = (uint *)0x0; (long)mesh.vbo_id < 1;
      mesh.vbo_id = (uint *)((long)mesh.vbo_id + 1)) {
    local_258 = attrib.num_normals * 3;
    local_254 = attrib.num_normals;
    rVar9.proc_name._0_4_ = 0x1b3323;
    rVar9.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    rVar9.proc_name._4_4_ = 0;
    rVar9.line_in_file = 0x827c;
    auVar17._8_8_ = (ulong)uStack_274 << 0x20;
    auVar17._0_8_ = (ulong)(attrib.num_normals * 9) << 2;
    auVar17._16_8_ = 0;
    mesh._0_8_ = (*prVar23)((rf_allocator *)&temp_allocator_local.allocator_proc,rVar9,RF_AM_ALLOC,
                            (rf_allocator_args)(auVar17 << 0x40));
    rVar10.proc_name._0_4_ = 0x1b3323;
    rVar10.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    rVar10.proc_name._4_4_ = 0;
    rVar10.line_in_file = 0x827d;
    auVar18._8_8_ = (ulong)uStack_2a4 << 0x20;
    auVar18._0_8_ = (ulong)(attrib.num_normals * 6) << 2;
    auVar18._16_8_ = 0;
    mesh.vertices =
         (float *)(*prVar23)((rf_allocator *)&temp_allocator_local.allocator_proc,rVar10,RF_AM_ALLOC
                             ,(rf_allocator_args)(auVar18 << 0x40));
    mesh.texcoords = (float *)0x0;
    rVar11.proc_name._0_4_ = 0x1b3323;
    rVar11.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    rVar11.proc_name._4_4_ = 0;
    rVar11.line_in_file = 0x827e;
    auVar19._8_8_ = (ulong)uStack_2d4 << 0x20;
    auVar19._0_8_ = (ulong)(attrib.num_normals * 9) << 2;
    auVar19._16_8_ = 0;
    mesh.texcoords2 =
         (float *)(*prVar23)((rf_allocator *)&temp_allocator_local.allocator_proc,rVar11,RF_AM_ALLOC
                             ,(rf_allocator_args)(auVar19 << 0x40));
    mesh.normals = (float *)0x0;
    mesh.tangents = (float *)0x0;
    mesh.colors = (uchar *)0x0;
    mesh.indices = (unsigned_short *)0x0;
    mesh.anim_vertices = (float *)0x0;
    mesh.anim_normals = (float *)0x0;
    mesh.bone_ids = (int *)0x0;
    mesh.bone_weights._0_4_ = 0;
    rVar12.proc_name._0_4_ = 0x1b3323;
    rVar12.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    rVar12.proc_name._4_4_ = 0;
    rVar12.line_in_file = 0x827f;
    rVar15._16_8_ = (ulong)uStack_304 << 0x20;
    rVar15.pointer_to_free_or_realloc = (void *)SUB168(ZEXT816(0x1c) << 0x40,0);
    rVar15.size_to_allocate_or_reallocate = SUB168(ZEXT816(0x1c) << 0x40,8);
    mesh._96_8_ = (*prVar23)((rf_allocator *)&temp_allocator_local.allocator_proc,rVar12,RF_AM_ALLOC
                             ,rVar15);
    memset((void *)mesh._0_8_,0,(long)(local_258 * 3) << 2);
    memset(mesh.vertices,0,(long)(local_258 << 1) << 2);
    memset(mesh.texcoords2,0,(long)(local_258 * 3) << 2);
    memset((void *)mesh._96_8_,0,0x1c);
    vnCount = 0;
    local_320 = 0;
    f._4_4_ = 0;
    idx0.vt_idx = 0;
    idx0.vn_idx = 0;
    for (; (long)idx0._4_8_ < (long)(ulong)attrib.num_normals; idx0._4_8_ = idx0._4_8_ + 1) {
      uVar3 = *(undefined8 *)(attrib.texcoords + idx0._4_8_ * 9);
      fVar1 = (attrib.texcoords + idx0._4_8_ * 9)[2];
      pfVar22 = attrib.texcoords + (idx0._4_8_ * 3 + 1) * 3;
      idx2.vt_idx = (int)pfVar22[0];
      idx2.vn_idx = (int)pfVar22[1];
      fVar2 = pfVar22[2];
      uVar4 = *(undefined8 *)(attrib.texcoords + (idx0._4_8_ * 3 + 2) * 3);
      idx2.v_idx = (int)(attrib.texcoords + (idx0._4_8_ * 3 + 2) * 3)[2];
      for (v_1 = 0; v_1 < 3; v_1 = v_1 + 1) {
        idx1.vt_idx = (int)uVar3;
        *(undefined4 *)(mesh._0_8_ + (vnCount + v_1) * 4) =
             *(undefined4 *)(attrib._16_8_ + (idx1.vt_idx * 3 + v_1) * 4);
      }
      for (v_2 = 0; v_2 < 3; v_2 = v_2 + 1) {
        *(undefined4 *)(mesh._0_8_ + ((vnCount + 3) + v_2) * 4) =
             *(undefined4 *)(attrib._16_8_ + (idx2.vt_idx * 3 + v_2) * 4);
      }
      for (v_3 = 0; v_3 < 3; v_3 = v_3 + 1) {
        v._4_4_ = (int)uVar4;
        *(undefined4 *)(mesh._0_8_ + ((vnCount + 6) + v_3) * 4) =
             *(undefined4 *)(attrib._16_8_ + (v._4_4_ * 3 + v_3) * 4);
      }
      vnCount = vnCount + 9;
      idx1.vn_idx = (int)((ulong)uVar3 >> 0x20);
      mesh.vertices[local_320] = attrib.normals[idx1.vn_idx << 1];
      mesh.vertices[local_320 + 1] = 1.0 - attrib.normals[idx1.vn_idx * 2 + 1];
      mesh.vertices[local_320 + 2] = attrib.normals[idx2.vn_idx << 1];
      mesh.vertices[local_320 + 3] = 1.0 - attrib.normals[idx2.vn_idx * 2 + 1];
      iStack_350 = (int)((ulong)uVar4 >> 0x20);
      mesh.vertices[local_320 + 4] = attrib.normals[iStack_350 << 1];
      mesh.vertices[local_320 + 5] = 1.0 - attrib.normals[iStack_350 * 2 + 1];
      local_320 = local_320 + 6;
      for (v_4 = 0; v_4 < 3; v_4 = v_4 + 1) {
        mesh.texcoords2[f._4_4_ + v_4] = attrib.vertices[(int)fVar1 * 3 + v_4];
      }
      for (v_5 = 0; v_5 < 3; v_5 = v_5 + 1) {
        mesh.texcoords2[(f._4_4_ + 3) + v_5] = attrib.vertices[(int)fVar2 * 3 + v_5];
      }
      for (m_1 = 0; m_1 < 3; m_1 = m_1 + 1) {
        mesh.texcoords2[(f._4_4_ + 6) + m_1] = attrib.vertices[idx2.v_idx * 3 + m_1];
      }
      f._4_4_ = f._4_4_ + 9;
      unique0x10001713 = uVar4;
    }
    memcpy((void *)((long)__s + (long)mesh.vbo_id * 0x70),&local_258,0x70);
    *(int *)((long)__s_00 + (long)mesh.vbo_id * 4) = attrib.face_num_verts[(long)mesh.vbo_id];
    if (*(int *)((long)__s_00 + (long)mesh.vbo_id * 4) == -1) {
      *(undefined4 *)((long)__s_00 + (long)mesh.vbo_id * 4) = 0;
    }
  }
  for (local_390 = (rf_mesh *)0x0; local_390 < _ret;
      local_390 = (rf_mesh *)((long)&local_390->vertex_count + 1)) {
    lVar24 = (long)local_390 * 0x98;
    allocator_00.allocator_proc = prVar23;
    allocator_00.user_data = temp_allocator_local.allocator_proc;
    rf_load_default_material(&local_428,allocator_00);
    memcpy((void *)(model.material_count + lVar24),&local_428,0x98);
    puVar5 = *(undefined8 **)(model.material_count + (long)local_390 * 0x98 + 0x88);
    rf_get_default_texture();
    *puVar5 = local_440;
    puVar5[1] = local_438;
    puVar5[2] = local_430;
    if (*(long *)(material_count + (long)local_390 * 0x90 + 0x60) != 0) {
      puVar5 = *(undefined8 **)(model.material_count + (long)local_390 * 0x98 + 0x88);
      temp_allocator_00.allocator_proc = (rf_allocator_proc *)temp_allocator_local.user_data;
      temp_allocator_00.user_data = pvVar25;
      rf_load_texture_from_file
                (&local_458,*(char **)(material_count + (long)local_390 * 0x90 + 0x60),
                 temp_allocator_00,io);
      *puVar5 = local_458._0_8_;
      puVar5[1] = local_458._8_8_;
      puVar5[2] = local_458._16_8_;
    }
    local_45c = CONCAT13(0xff,CONCAT12((char)(int)(*(float *)(material_count + 0x1c +
                                                             (long)local_390 * 0x90) * 255.0),
                                       CONCAT11((char)(int)(*(float *)(material_count + 0x18 +
                                                                      (long)local_390 * 0x90) *
                                                           255.0),
                                                (char)(int)(*(float *)(material_count + 0x14 +
                                                                      (long)local_390 * 0x90) *
                                                           255.0))));
    *(undefined4 *)(*(long *)(model.material_count + 0x88 + (long)local_390 * 0x98) + 0x18) =
         local_45c;
    *(undefined4 *)(*(long *)(model.material_count + (long)local_390 * 0x98 + 0x88) + 0x1c) = 0;
    if (*(long *)(material_count + (long)local_390 * 0x90 + 0x68) != 0) {
      lVar24 = *(long *)(model.material_count + (long)local_390 * 0x98 + 0x88);
      temp_allocator_01.allocator_proc = (rf_allocator_proc *)temp_allocator_local.user_data;
      temp_allocator_01.user_data = pvVar25;
      rf_load_texture_from_file
                (&local_474,*(char **)(material_count + (long)local_390 * 0x90 + 0x68),
                 temp_allocator_01,io);
      *(undefined8 *)(lVar24 + 0x20) = local_474._0_8_;
      *(undefined8 *)(lVar24 + 0x28) = local_474._8_8_;
      *(undefined8 *)(lVar24 + 0x30) = local_474._16_8_;
    }
    local_478 = CONCAT13(0xff,CONCAT12((char)(int)(*(float *)(material_count + 0x28 +
                                                             (long)local_390 * 0x90) * 255.0),
                                       CONCAT11((char)(int)(*(float *)(material_count + 0x24 +
                                                                      (long)local_390 * 0x90) *
                                                           255.0),
                                                (char)(int)(*(float *)(material_count + 0x20 +
                                                                      (long)local_390 * 0x90) *
                                                           255.0))));
    *(undefined4 *)(*(long *)(model.material_count + 0x88 + (long)local_390 * 0x98) + 0x38) =
         local_478;
    *(undefined4 *)(*(long *)(model.material_count + (long)local_390 * 0x98 + 0x88) + 0x3c) = 0;
    if (*(long *)(material_count + (long)local_390 * 0x90 + 0x78) != 0) {
      lVar24 = *(long *)(model.material_count + (long)local_390 * 0x98 + 0x88);
      temp_allocator_02.allocator_proc = (rf_allocator_proc *)temp_allocator_local.user_data;
      temp_allocator_02.user_data = pvVar25;
      rf_load_texture_from_file
                (&local_490,*(char **)(material_count + (long)local_390 * 0x90 + 0x78),
                 temp_allocator_02,io);
      *(undefined8 *)(lVar24 + 0x40) = local_490._0_8_;
      *(undefined8 *)(lVar24 + 0x48) = local_490._8_8_;
      *(undefined8 *)(lVar24 + 0x50) = local_490._16_8_;
    }
    local_494 = 0xffffffff;
    *(undefined4 *)(*(long *)(model.material_count + 0x88 + (long)local_390 * 0x98) + 0x58) =
         0xffffffff;
    *(undefined4 *)(*(long *)(model.material_count + 0x88 + (long)local_390 * 0x98) + 0x5c) =
         *(undefined4 *)(material_count + 0x44 + (long)local_390 * 0x90);
    local_498 = CONCAT13(0xff,CONCAT12((char)(int)(*(float *)(material_count + 0x40 +
                                                             (long)local_390 * 0x90) * 255.0),
                                       CONCAT11((char)(int)(*(float *)(material_count + 0x3c +
                                                                      (long)local_390 * 0x90) *
                                                           255.0),
                                                (char)(int)(*(float *)(material_count + 0x38 +
                                                                      (long)local_390 * 0x90) *
                                                           255.0))));
    *(undefined4 *)(*(long *)(model.material_count + 0x88 + (long)local_390 * 0x98) + 0xb8) =
         local_498;
    if (*(long *)(material_count + (long)local_390 * 0x90 + 0x80) != 0) {
      lVar24 = *(long *)(model.material_count + (long)local_390 * 0x98 + 0x88);
      temp_allocator_03.allocator_proc = (rf_allocator_proc *)temp_allocator_local.user_data;
      temp_allocator_03.user_data = pvVar25;
      rf_load_texture_from_file
                (&local_4b0,*(char **)(material_count + (long)local_390 * 0x90 + 0x80),
                 temp_allocator_03,io);
      *(undefined8 *)(lVar24 + 0xc0) = local_4b0._0_8_;
      *(undefined8 *)(lVar24 + 200) = local_4b0._8_8_;
      *(undefined8 *)(lVar24 + 0xd0) = local_4b0._16_8_;
    }
  }
  tinyobj_attrib_free((tinyobj_attrib_t *)&meshes);
  tinyobj_shapes_free((tinyobj_shape_t *)mesh_count,(size_t)materials);
  tinyobj_materials_free((tinyobj_material_t *)material_count,(size_t)_ret);
  lVar24 = *in_FS_OFFSET;
  local_4c0 = 0;
  local_4b8 = 0;
  *(undefined8 *)(lVar24 + -0x440) = 0;
  *(undefined8 *)(lVar24 + -0x438) = 0;
  lVar24 = *in_FS_OFFSET;
  memset(&local_4d8,0,0x18);
  *(undefined8 *)(lVar24 + -0x430) = local_4d8;
  *(undefined8 *)(lVar24 + -0x428) = local_4d0;
  *(undefined8 *)(lVar24 + -0x420) = local_4c8;
  rf_log_impl(2,0x1b33ad,filename);
  allocator_01.allocator_proc = prVar23;
  allocator_01.user_data = temp_allocator_local.allocator_proc;
  temp_allocator_04.allocator_proc = (rf_allocator_proc *)temp_allocator_local.user_data;
  temp_allocator_04.user_data = pvVar25;
  model_00.transform.m8 = model.transform.m0;
  model_00.transform._0_8_ = attrib.material_ids;
  model_00.transform.m12 = model.transform.m4;
  model_00.transform._16_8_ = model.transform._8_8_;
  model_00.transform._24_8_ = model.transform._16_8_;
  model_00.transform._32_8_ = model.transform._24_8_;
  model_00.transform._40_8_ = model.transform._32_8_;
  model_00.transform._48_8_ = model.transform._40_8_;
  model_00.transform._56_8_ = model.transform._48_8_;
  model_00.mesh_count = 1;
  model_00.meshes = (rf_mesh *)__s;
  model_00.material_count = (rf_int)model.meshes;
  model_00.materials = (rf_material *)model.material_count;
  model_00.mesh_material = (int *)__s_00;
  model_00.bone_count = (rf_int)model.mesh_material;
  model_00.bones = (rf_bone_info *)model.bone_count;
  model_00.bind_pose = (rf_transform *)model.bones;
  rf_load_meshes_and_materials_for_model
            (__return_storage_ptr__,model_00,allocator_01,temp_allocator_04);
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_model rf_load_model_from_obj(const char* filename, rf_allocator allocator, rf_allocator temp_allocator, rf_io_callbacks io)
{
    rf_model model  = {0};
    allocator = allocator;

    tinyobj_attrib_t attrib     = {0};
    tinyobj_shape_t* meshes     = NULL;
    size_t           mesh_count = 0;

    tinyobj_material_t* materials      = NULL;
    size_t              material_count = 0;

    RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(temp_allocator); // Set to NULL at the end of the function
    RF_SET_TINYOBJ_IO_CALLBACKS(io);
    {
        unsigned int flags = TINYOBJ_FLAG_TRIANGULATE;
        int ret            = tinyobj_parse_obj(&attrib, &meshes, (size_t*) &mesh_count, &materials, &material_count, filename, rf_tinyobj_file_reader_callback, flags);

        if (ret != TINYOBJ_SUCCESS)
        {
            RF_LOG(RF_LOG_TYPE_WARNING, "Model data could not be loaded. Filename %s", filename);
        }
        else
        {
            RF_LOG(RF_LOG_TYPE_INFO, "Model data loaded successfully: %i meshes / %i materials, filename: %s", mesh_count, material_count, filename);
        }

        // Init model meshes array
        {
            // TODO: Support multiple meshes... in the meantime, only one mesh is returned
            //model.mesh_count = mesh_count;
            model.mesh_count = 1;
            model.meshes     = (rf_mesh*) RF_ALLOC(allocator, model.mesh_count * sizeof(rf_mesh));
            memset(model.meshes, 0, model.mesh_count * sizeof(rf_mesh));
        }

        // Init model materials array
        if (material_count > 0)
        {
            model.material_count = material_count;
            model.materials      = (rf_material*) RF_ALLOC(allocator, model.material_count * sizeof(rf_material));
            memset(model.materials, 0, model.material_count * sizeof(rf_material));
        }

        model.mesh_material = (int*) RF_ALLOC(allocator, model.mesh_count * sizeof(int));
        memset(model.mesh_material, 0, model.mesh_count * sizeof(int));

        // Init model meshes
        for (rf_int m = 0; m < 1; m++)
        {
            rf_mesh mesh = (rf_mesh)
            {
                .vertex_count   = attrib.num_faces * 3,
                .triangle_count = attrib.num_faces,

                .vertices  = (float*)        RF_ALLOC(allocator, (attrib.num_faces * 3) * 3 * sizeof(float)),
                .texcoords = (float*)        RF_ALLOC(allocator, (attrib.num_faces * 3) * 2 * sizeof(float)),
                .normals   = (float*)        RF_ALLOC(allocator, (attrib.num_faces * 3) * 3 * sizeof(float)),
                .vbo_id    = (unsigned int*) RF_ALLOC(allocator, RF_MAX_MESH_VBO            * sizeof(unsigned int)),
            };

            memset(mesh.vertices,  0, mesh.vertex_count * 3 * sizeof(float));
            memset(mesh.texcoords, 0, mesh.vertex_count * 2 * sizeof(float));
            memset(mesh.normals,   0, mesh.vertex_count * 3 * sizeof(float));
            memset(mesh.vbo_id,    0, RF_MAX_MESH_VBO       * sizeof(unsigned int));

            int vCount  = 0;
            int vtCount = 0;
            int vnCount = 0;

            for (rf_int f = 0; f < attrib.num_faces; f++)
            {
                // Get indices for the face
                tinyobj_vertex_index_t idx0 = attrib.faces[3 * f + 0];
                tinyobj_vertex_index_t idx1 = attrib.faces[3 * f + 1];
                tinyobj_vertex_index_t idx2 = attrib.faces[3 * f + 2];

                // RF_LOG(RF_LOG_TYPE_DEBUG, "Face %i index: v %i/%i/%i . vt %i/%i/%i . vn %i/%i/%i\n", f, idx0.v_idx, idx1.v_idx, idx2.v_idx, idx0.vt_idx, idx1.vt_idx, idx2.vt_idx, idx0.vn_idx, idx1.vn_idx, idx2.vn_idx);

                // Fill vertices buffer (float) using vertex index of the face
                for (rf_int v = 0; v < 3; v++) { mesh.vertices[vCount + v] = attrib.vertices[idx0.v_idx * 3 + v]; }
                vCount +=3;

                for (rf_int v = 0; v < 3; v++) { mesh.vertices[vCount + v] = attrib.vertices[idx1.v_idx * 3 + v]; }
                vCount +=3;

                for (rf_int v = 0; v < 3; v++) { mesh.vertices[vCount + v] = attrib.vertices[idx2.v_idx * 3 + v]; }
                vCount +=3;

                // Fill texcoords buffer (float) using vertex index of the face
                // NOTE: Y-coordinate must be flipped upside-down
                mesh.texcoords[vtCount + 0] = attrib.texcoords[idx0.vt_idx * 2 + 0];
                mesh.texcoords[vtCount + 1] = 1.0f - attrib.texcoords[idx0.vt_idx * 2 + 1]; vtCount += 2;
                mesh.texcoords[vtCount + 0] = attrib.texcoords[idx1.vt_idx * 2 + 0];
                mesh.texcoords[vtCount + 1] = 1.0f - attrib.texcoords[idx1.vt_idx * 2 + 1]; vtCount += 2;
                mesh.texcoords[vtCount + 0] = attrib.texcoords[idx2.vt_idx * 2 + 0];
                mesh.texcoords[vtCount + 1] = 1.0f - attrib.texcoords[idx2.vt_idx * 2 + 1]; vtCount += 2;

                // Fill normals buffer (float) using vertex index of the face
                for (rf_int v = 0; v < 3; v++) { mesh.normals[vnCount + v] = attrib.normals[idx0.vn_idx * 3 + v]; }
                vnCount +=3;

                for (rf_int v = 0; v < 3; v++) { mesh.normals[vnCount + v] = attrib.normals[idx1.vn_idx * 3 + v]; }
                vnCount +=3;

                for (rf_int v = 0; v < 3; v++) { mesh.normals[vnCount + v] = attrib.normals[idx2.vn_idx * 3 + v]; }
                vnCount +=3;
            }

            model.meshes[m] = mesh; // Assign mesh data to model

            // Assign mesh material for current mesh
            model.mesh_material[m] = attrib.material_ids[m];

            // Set unfound materials to default
            if (model.mesh_material[m] == -1) { model.mesh_material[m] = 0; }
        }

        // Init model materials
        for (rf_int m = 0; m < material_count; m++)
        {
            // Init material to default
            // NOTE: Uses default shader, only RF_MAP_DIFFUSE supported
            model.materials[m] = rf_load_default_material(allocator);
            model.materials[m].maps[RF_MAP_DIFFUSE].texture = rf_get_default_texture(); // Get default texture, in case no texture is defined

            if (materials[m].diffuse_texname != NULL)
            {
                model.materials[m].maps[RF_MAP_DIFFUSE].texture = rf_load_texture_from_file(materials[m].diffuse_texname, temp_allocator, io); //char* diffuse_texname; // map_Kd
            }

            model.materials[m].maps[RF_MAP_DIFFUSE].color = (rf_color)
            {
                (float)(materials[m].diffuse[0] * 255.0f),
                (float)(materials[m].diffuse[1] * 255.0f),
                (float)(materials[m].diffuse[2] * 255.0f),
                255
            };

            model.materials[m].maps[RF_MAP_DIFFUSE].value = 0.0f;

            if (materials[m].specular_texname != NULL)
            {
                model.materials[m].maps[RF_MAP_SPECULAR].texture = rf_load_texture_from_file(materials[m].specular_texname, temp_allocator, io); //char* specular_texname; // map_Ks
            }

            model.materials[m].maps[RF_MAP_SPECULAR].color = (rf_color)
            {
                (float)(materials[m].specular[0] * 255.0f),
                (float)(materials[m].specular[1] * 255.0f),
                (float)(materials[m].specular[2] * 255.0f),
                255
            };

            model.materials[m].maps[RF_MAP_SPECULAR].value = 0.0f;

            if (materials[m].bump_texname != NULL)
            {
                model.materials[m].maps[RF_MAP_NORMAL].texture = rf_load_texture_from_file(materials[m].bump_texname, temp_allocator, io); //char* bump_texname; // map_bump, bump
            }

            model.materials[m].maps[RF_MAP_NORMAL].color = RF_WHITE;
            model.materials[m].maps[RF_MAP_NORMAL].value = materials[m].shininess;

            model.materials[m].maps[RF_MAP_EMISSION].color = (rf_color)
            {
                (float)(materials[m].emission[0] * 255.0f),
                (float)(materials[m].emission[1] * 255.0f),
                (float)(materials[m].emission[2] * 255.0f),
                255
            };

            if (materials[m].displacement_texname != NULL)
            {
                model.materials[m].maps[RF_MAP_HEIGHT].texture = rf_load_texture_from_file(materials[m].displacement_texname, temp_allocator, io); //char* displacement_texname; // disp
            }
        }

        tinyobj_attrib_free(&attrib);
        tinyobj_shapes_free(meshes, mesh_count);
        tinyobj_materials_free(materials, material_count);
    }
    RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(RF_NULL_ALLOCATOR);
    RF_SET_TINYOBJ_IO_CALLBACKS(RF_NULL_IO);

    // NOTE: At this point we have all model data loaded
    RF_LOG(RF_LOG_TYPE_INFO, "Model loaded successfully in RAM. Filename: %s", filename);

    return rf_load_meshes_and_materials_for_model(model, allocator, temp_allocator);
}